

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# left_right.cpp
# Opt level: O0

ScalarFunction * duckdb::LeftGraphemeFun::GetFunction(void)

{
  initializer_list<duckdb::LogicalType> iVar1;
  ScalarFunction *in_RDI;
  function_statistics_t in_stack_00000030;
  init_local_state_t in_stack_00000038;
  LogicalType *in_stack_00000040;
  FunctionStability in_stack_00000048;
  FunctionNullHandling in_stack_00000050;
  bind_lambda_function_t in_stack_00000058;
  allocator_type *in_stack_fffffffffffffea8;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffffeb0;
  _func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  LogicalTypeId in_stack_fffffffffffffecf;
  LogicalType *in_stack_fffffffffffffed0;
  undefined1 *local_e8;
  undefined1 local_60 [48];
  bind_scalar_function_extended_t bind_extended;
  bind_scalar_function_t bind;
  scalar_function_t *in_stack_ffffffffffffffe0;
  LogicalType *in_stack_ffffffffffffffe8;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffffff0;
  ScalarFunction *this;
  
  this = in_RDI;
  LogicalType::LogicalType(in_stack_fffffffffffffed0,in_stack_fffffffffffffecf);
  LogicalType::LogicalType(in_stack_fffffffffffffed0,in_stack_fffffffffffffecf);
  bind_extended = (bind_scalar_function_extended_t)local_60;
  bind = (bind_scalar_function_t)0x2;
  ::std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0x2143468);
  iVar1._M_len._0_4_ = in_stack_fffffffffffffec0;
  iVar1._M_array = (iterator)in_stack_fffffffffffffeb8;
  iVar1._M_len._4_4_ = in_stack_fffffffffffffec4;
  vector<duckdb::LogicalType,_true>::vector
            (in_stack_fffffffffffffeb0,iVar1,in_stack_fffffffffffffea8);
  LogicalType::LogicalType(in_stack_fffffffffffffed0,in_stack_fffffffffffffecf);
  ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
  function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),in_stack_fffffffffffffeb8
            );
  LogicalType::LogicalType(in_stack_fffffffffffffed0,in_stack_fffffffffffffecf);
  ScalarFunction::ScalarFunction
            (this,in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,bind
             ,bind_extended,in_stack_00000030,in_stack_00000038,in_stack_00000040,in_stack_00000048,
             in_stack_00000050,in_stack_00000058);
  LogicalType::~LogicalType((LogicalType *)0x2143535);
  ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
  ~function((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
            0x2143542);
  LogicalType::~LogicalType((LogicalType *)0x214354f);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x214355c);
  ::std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0x2143569);
  local_e8 = &stack0xffffffffffffffd0;
  do {
    local_e8 = local_e8 + -0x18;
    LogicalType::~LogicalType((LogicalType *)0x2143592);
  } while (local_e8 != local_60);
  return in_RDI;
}

Assistant:

ScalarFunction LeftGraphemeFun::GetFunction() {
	return ScalarFunction({LogicalType::VARCHAR, LogicalType::BIGINT}, LogicalType::VARCHAR,
	                      LeftFunction<LeftRightGrapheme>);
}